

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::OneofDescriptorTest::SetUp(OneofDescriptorTest *this)

{
  RepeatedPtrField<google::protobuf::OneofDescriptorProto> *this_00;
  DescriptorProto *parent;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>_>
  *pVVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar2;
  FileDescriptor *pFVar3;
  Descriptor *pDVar4;
  OneofDescriptor *pOVar5;
  FieldDescriptor *pFVar6;
  InternalMetadata arena;
  Arena *pAVar7;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  char *pcVar8;
  char *in_R9;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_02;
  AssertHelper local_150;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_118;
  FileDescriptorProto baz_file;
  
  FileDescriptorProto::FileDescriptorProto(&baz_file);
  baz_file.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       baz_file.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
  arena = baz_file.super_Message.super_MessageLite._internal_metadata_;
  if ((baz_file.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    arena.ptr_ = *(undefined8 *)
                  (baz_file.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                  0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&baz_file.field_0._impl_.name_,"baz.proto",(Arena *)arena.ptr_);
  baz_file.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       baz_file.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 2;
  if ((baz_file.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    baz_file.super_Message.super_MessageLite._internal_metadata_.ptr_ =
         *(undefined8 *)
          (baz_file.super_Message.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set
            (&baz_file.field_0._impl_.package_,"garply",
             (Arena *)baz_file.super_Message.super_MessageLite._internal_metadata_.ptr_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"TestOneof",(allocator<char> *)&gtest_ar_);
  parent = AddMessage(&baz_file,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  this_00 = &(parent->field_0)._impl_.oneof_decl_;
  pVVar1 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
                     (&this_00->super_RepeatedPtrFieldBase);
  *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 1;
  pAVar7 = (Arena *)(pVVar1->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar7 & 1) != 0) {
    pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(pVVar1->field_0)._impl_.name_,"foo",pAVar7);
  pVVar1 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
                     (&this_00->super_RepeatedPtrFieldBase);
  *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 1;
  pAVar7 = (Arena *)(pVVar1->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar7 & 1) != 0) {
    pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(pVVar1->field_0)._impl_.name_,"bar",pAVar7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"a",(allocator<char> *)&gtest_ar_);
  AddField(parent,(string *)&gtest_ar,1,FieldDescriptorProto_Label_LABEL_OPTIONAL,
           FieldDescriptorProto_Type_TYPE_INT32);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"b",(allocator<char> *)&gtest_ar_);
  AddField(parent,(string *)&gtest_ar,2,FieldDescriptorProto_Label_LABEL_OPTIONAL,
           FieldDescriptorProto_Type_TYPE_STRING);
  std::__cxx11::string::~string((string *)&gtest_ar);
  this_02 = &(parent->field_0)._impl_.field_;
  pVVar2 = internal::RepeatedPtrFieldBase::
           Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                     (&this_02->super_RepeatedPtrFieldBase,1);
  (pVVar2->field_0)._impl_.oneof_index_ = 0;
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 0x80;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"c",(allocator<char> *)&gtest_ar_);
  AddField(parent,(string *)&gtest_ar,3,FieldDescriptorProto_Label_LABEL_OPTIONAL,
           FieldDescriptorProto_Type_TYPE_MESSAGE);
  std::__cxx11::string::~string((string *)&gtest_ar);
  pVVar2 = internal::RepeatedPtrFieldBase::
           Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                     (&this_02->super_RepeatedPtrFieldBase,2);
  (pVVar2->field_0)._impl_.oneof_index_ = 0;
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 0x80;
  pVVar2 = internal::RepeatedPtrFieldBase::
           Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                     (&this_02->super_RepeatedPtrFieldBase,2);
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 4;
  pAVar7 = (Arena *)(pVVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar7 & 1) != 0) {
    pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(pVVar2->field_0)._impl_.type_name_,"TestOneof",pAVar7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"d",(allocator<char> *)&gtest_ar_);
  AddField(parent,(string *)&gtest_ar,4,FieldDescriptorProto_Label_LABEL_OPTIONAL,
           FieldDescriptorProto_Type_TYPE_FLOAT);
  std::__cxx11::string::~string((string *)&gtest_ar);
  pVVar2 = internal::RepeatedPtrFieldBase::
           Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                     (&this_02->super_RepeatedPtrFieldBase,3);
  (pVVar2->field_0)._impl_.oneof_index_ = 1;
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 0x80;
  pFVar3 = DescriptorPool::BuildFile(&this->pool_,&baz_file);
  this->baz_file_ = pFVar3;
  this_01 = &gtest_ar_.message_;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = pFVar3 != (FileDescriptor *)0x0;
  if (pFVar3 == (FileDescriptor *)0x0) {
    testing::Message::Message((Message *)&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"baz_file_ != nullptr",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x59f,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((long *)CONCAT44(local_150.data_._4_4_,(int)local_150.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_150.data_._4_4_,(int)local_150.data_) + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_01);
    gtest_ar_.success_ = true;
    gtest_ar_._1_3_ = 0;
    local_150.data_._0_4_ = this->baz_file_->message_type_count_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"1","baz_file_->message_type_count()",(int *)&gtest_ar_,
               (int *)&local_150);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar8 = anon_var_dwarf_651463 + 5;
      }
      else {
        pcVar8 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x5a1,pcVar8);
      testing::internal::AssertHelper::operator=(&local_150,(Message *)&gtest_ar_);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      pDVar4 = FileDescriptor::message_type(this->baz_file_,0);
      this->oneof_message_ = pDVar4;
      gtest_ar_.success_ = true;
      gtest_ar_._1_3_ = 0;
      local_150.data_._0_4_ = pDVar4->oneof_decl_count_;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"2","oneof_message_->oneof_decl_count()",(int *)&gtest_ar_,
                 (int *)&local_150);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar8 = anon_var_dwarf_651463 + 5;
        }
        else {
          pcVar8 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_150,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x5a4,pcVar8);
        testing::internal::AssertHelper::operator=(&local_150,(Message *)&gtest_ar_);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        pOVar5 = Descriptor::oneof_decl(this->oneof_message_,0);
        this->oneof_ = pOVar5;
        pOVar5 = Descriptor::oneof_decl(this->oneof_message_,1);
        this->oneof2_ = pOVar5;
        gtest_ar_.success_ = true;
        gtest_ar_._1_3_ = 0;
        local_150.data_._0_4_ = this->oneof_message_->field_count_;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"4","oneof_message_->field_count()",(int *)&gtest_ar_,
                   (int *)&local_150);
        if (gtest_ar.success_ != false) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          pFVar6 = Descriptor::field(this->oneof_message_,0);
          this->a_ = pFVar6;
          pFVar6 = Descriptor::field(this->oneof_message_,1);
          this->b_ = pFVar6;
          pFVar6 = Descriptor::field(this->oneof_message_,2);
          this->c_ = pFVar6;
          pFVar6 = Descriptor::field(this->oneof_message_,3);
          this->d_ = pFVar6;
          goto LAB_004bf916;
        }
        testing::Message::Message((Message *)&gtest_ar_);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar8 = anon_var_dwarf_651463 + 5;
        }
        else {
          pcVar8 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_150,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x5a8,pcVar8);
        testing::internal::AssertHelper::operator=(&local_150,(Message *)&gtest_ar_);
      }
    }
    this_01 = &gtest_ar.message_;
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_01);
LAB_004bf916:
  FileDescriptorProto::~FileDescriptorProto(&baz_file);
  return;
}

Assistant:

void SetUp() override {
    // Build descriptors for the following definitions:
    //
    //   package garply;
    //   message TestOneof {
    //     optional int32 a = 1;
    //     oneof foo {
    //       string b = 2;
    //       TestOneof c = 3;
    //     }
    //     oneof bar {
    //       float d = 4;
    //     }
    //   }

    FileDescriptorProto baz_file;
    baz_file.set_name("baz.proto");
    baz_file.set_package("garply");

    DescriptorProto* oneof_message = AddMessage(&baz_file, "TestOneof");
    oneof_message->add_oneof_decl()->set_name("foo");
    oneof_message->add_oneof_decl()->set_name("bar");

    AddField(oneof_message, "a", 1, FieldDescriptorProto::LABEL_OPTIONAL,
             FieldDescriptorProto::TYPE_INT32);
    AddField(oneof_message, "b", 2, FieldDescriptorProto::LABEL_OPTIONAL,
             FieldDescriptorProto::TYPE_STRING);
    oneof_message->mutable_field(1)->set_oneof_index(0);
    AddField(oneof_message, "c", 3, FieldDescriptorProto::LABEL_OPTIONAL,
             FieldDescriptorProto::TYPE_MESSAGE);
    oneof_message->mutable_field(2)->set_oneof_index(0);
    oneof_message->mutable_field(2)->set_type_name("TestOneof");

    AddField(oneof_message, "d", 4, FieldDescriptorProto::LABEL_OPTIONAL,
             FieldDescriptorProto::TYPE_FLOAT);
    oneof_message->mutable_field(3)->set_oneof_index(1);

    // Build the descriptors and get the pointers.
    baz_file_ = pool_.BuildFile(baz_file);
    ASSERT_TRUE(baz_file_ != nullptr);

    ASSERT_EQ(1, baz_file_->message_type_count());
    oneof_message_ = baz_file_->message_type(0);

    ASSERT_EQ(2, oneof_message_->oneof_decl_count());
    oneof_ = oneof_message_->oneof_decl(0);
    oneof2_ = oneof_message_->oneof_decl(1);

    ASSERT_EQ(4, oneof_message_->field_count());
    a_ = oneof_message_->field(0);
    b_ = oneof_message_->field(1);
    c_ = oneof_message_->field(2);
    d_ = oneof_message_->field(3);
  }